

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calculateEdgeLogLikelihoods
          (BeagleCPUImpl<float,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int count,double *outSumLogLikelihood,double *outSumFirstDerivative,
          double *outSumSecondDerivative)

{
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int scalingIndices [2];
  
  uVar2 = this->kFlags;
  if (count == 1) {
    uVar7 = 0;
    if (-1 < (char)uVar2) {
      if (((uint)uVar2 >> 8 & 1) == 0) {
        uVar7 = (ulong)(uint)*cumulativeScaleIndices;
      }
      else {
        uVar7 = (ulong)(uint)this->kInternalPartialsBufferCount;
        uVar8 = *parentBufferIndices - this->kTipCount;
        uVar6 = *childBufferIndices - this->kTipCount;
        (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x24])(this);
        if ((int)(uVar8 | uVar6) < 0) {
          if ((-1 < (int)uVar8) || (uVar8 = uVar6, -1 < (int)uVar6)) {
            scalingIndices[0] = uVar8;
            (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x20])(this,scalingIndices,1);
          }
        }
        else {
          scalingIndices[0] = uVar8;
          scalingIndices[1] = uVar6;
          (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x20])(this,scalingIndices,2,uVar7);
        }
      }
    }
    if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
      if (this->kAutoRootPartitioningEnabled == true) {
        (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x4e])
                  (this,parentBufferIndices,childBufferIndices,probabilityIndices,
                   categoryWeightsIndices,stateFrequenciesIndices,cumulativeScaleIndices,
                   this->gAutoPartitionIndices,this->gAutoPartitionOutSumLogLikelihoods);
        *outSumLogLikelihood = 0.0;
        iVar4 = this->kPartitionCount;
        if (0 < (long)iVar4) {
          pdVar3 = this->gAutoPartitionOutSumLogLikelihoods;
          dVar1 = *outSumLogLikelihood;
          lVar5 = 0;
          do {
            dVar1 = dVar1 + pdVar3[lVar5];
            *outSumLogLikelihood = dVar1;
            lVar5 = lVar5 + 1;
          } while (iVar4 != lVar5);
        }
        iVar4 = (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
      }
      else {
        iVar4 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x4c])
                          (this,(ulong)(uint)*parentBufferIndices,(ulong)(uint)*childBufferIndices,
                           (ulong)(uint)*probabilityIndices,(ulong)(uint)*categoryWeightsIndices,
                           (ulong)(uint)*stateFrequenciesIndices,uVar7,outSumLogLikelihood);
      }
    }
    else if (secondDerivativeIndices == (int *)0x0) {
      iVar4 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x52])
                        (this,(ulong)(uint)*parentBufferIndices,(ulong)(uint)*childBufferIndices,
                         (ulong)(uint)*probabilityIndices,(ulong)(uint)*firstDerivativeIndices,
                         (ulong)(uint)*categoryWeightsIndices,(ulong)(uint)*stateFrequenciesIndices,
                         uVar7,outSumLogLikelihood,outSumFirstDerivative);
    }
    else {
      iVar4 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x53])(this);
    }
  }
  else {
    if ((uVar2 & 0x180) != 0) {
      BeagleCPUImpl<float,1,0>::calculateEdgeLogLikelihoods();
    }
    if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
      iVar4 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x51])
                        (this,parentBufferIndices,childBufferIndices,probabilityIndices,
                         categoryWeightsIndices,stateFrequenciesIndices,cumulativeScaleIndices,
                         (ulong)(uint)count,outSumLogLikelihood);
    }
    else {
      BeagleCPUImpl<float,1,0>::calculateEdgeLogLikelihoods();
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateEdgeLogLikelihoods(const int* parentBufferIndices,
                                                             const int* childBufferIndices,
                                                             const int* probabilityIndices,
                                                             const int* firstDerivativeIndices,
                                                             const int* secondDerivativeIndices,
                                                             const int* categoryWeightsIndices,
                                                             const int* stateFrequenciesIndices,
                                                             const int* cumulativeScaleIndices,
                                                             int count,
                                                             double* outSumLogLikelihood,
                                                             double* outSumFirstDerivative,
                                                             double* outSumSecondDerivative) {
    // TODO: implement for count > 1

    if (count == 1) {
        int cumulativeScalingFactorIndex;
        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            cumulativeScalingFactorIndex = 0;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            cumulativeScalingFactorIndex = kInternalPartialsBufferCount;
            int child1ScalingIndex = parentBufferIndices[0] - kTipCount;
            int child2ScalingIndex = childBufferIndices[0] - kTipCount;
            resetScaleFactors(cumulativeScalingFactorIndex);
            if (child1ScalingIndex >= 0 && child2ScalingIndex >= 0) {
                int scalingIndices[2] = {child1ScalingIndex, child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 2, cumulativeScalingFactorIndex);
            } else if (child1ScalingIndex >= 0) {
                int scalingIndices[1] = {child1ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, cumulativeScalingFactorIndex);
            } else if (child2ScalingIndex >= 0) {
                int scalingIndices[1] = {child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, cumulativeScalingFactorIndex);
            }
        } else {
            cumulativeScalingFactorIndex = cumulativeScaleIndices[0];
        }
        if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL)

            if (kAutoRootPartitioningEnabled) {
                calcEdgeLogLikelihoodsByAutoPartitionAsync(parentBufferIndices,
                                                           childBufferIndices,
                                                           probabilityIndices,
                                                           categoryWeightsIndices,
                                                           stateFrequenciesIndices,
                                                           cumulativeScaleIndices,
                                                           gAutoPartitionIndices,
                                                           gAutoPartitionOutSumLogLikelihoods);

                *outSumLogLikelihood = 0.0;

                for (int i = 0; i < kPartitionCount; i++) {
                    *outSumLogLikelihood += gAutoPartitionOutSumLogLikelihoods[i];
                }

                if (*outSumLogLikelihood != *outSumLogLikelihood) {
                    return BEAGLE_ERROR_FLOATING_POINT;
                } else {
                    return BEAGLE_SUCCESS;
                }
            } else {
                return calcEdgeLogLikelihoods(parentBufferIndices[0], childBufferIndices[0], probabilityIndices[0],
                                       categoryWeightsIndices[0], stateFrequenciesIndices[0], cumulativeScalingFactorIndex,
                                       outSumLogLikelihood);
            }
        else if (secondDerivativeIndices == NULL)
            return calcEdgeLogLikelihoodsFirstDeriv(parentBufferIndices[0], childBufferIndices[0], probabilityIndices[0],
                                             firstDerivativeIndices[0], categoryWeightsIndices[0], stateFrequenciesIndices[0],
                                             cumulativeScalingFactorIndex, outSumLogLikelihood, outSumFirstDerivative);
        else
            return calcEdgeLogLikelihoodsSecondDeriv(parentBufferIndices[0], childBufferIndices[0], probabilityIndices[0],
                                              firstDerivativeIndices[0], secondDerivativeIndices[0], categoryWeightsIndices[0],
                                              stateFrequenciesIndices[0], cumulativeScalingFactorIndex, outSumLogLikelihood,
                                              outSumFirstDerivative, outSumSecondDerivative);
    } else {
        if ((kFlags & BEAGLE_FLAG_SCALING_AUTO) || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
            fprintf(stderr,"BeagleCPUImpl::calculateEdgeLogLikelihoods not yet implemented for count > 1 and auto/always scaling\n");
        }

        if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL) {
            return calcEdgeLogLikelihoodsMulti(parentBufferIndices, childBufferIndices, probabilityIndices,
                                          categoryWeightsIndices, stateFrequenciesIndices, cumulativeScaleIndices, count,
                                          outSumLogLikelihood);
        } else {
            fprintf(stderr,"BeagleCPUImpl::calculateEdgeLogLikelihoods not yet implemented for count > 1 and derivatives\n");
        }
    }
    return BEAGLE_SUCCESS;
}